

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O2

int UpnpSendActionExAsync
              (UpnpClient_Handle Hnd,char *ActionURL_const,char *ServiceType_const,
              char *DevUDN_const,IXML_Document *Header,IXML_Document *Act,Upnp_FunPtr Fun,
              void *Cookie_const)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  int iVar3;
  char *buf;
  char *buf_00;
  job_arg *arg;
  Handle_Info **HndInfo;
  Handle_Info *local_70;
  ThreadPoolJob job;
  
  job.requestTime.tv_usec = 0;
  job.priority = LOW_PRIORITY;
  job.jobId = 0;
  job.free_func = (free_routine)0x0;
  job.requestTime.tv_sec = 0;
  job.func = (start_routine)0x0;
  job.arg = (void *)0x0;
  if (UpnpSdkInit == 1) {
    iVar3 = 6;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xc28,"Inside UpnpSendActionExAsync\n");
    if (Header == (IXML_Document *)0x0) {
      iVar3 = UpnpSendActionAsync(Hnd,ActionURL_const,ServiceType_const,DevUDN_const,Act,Fun,
                                  Cookie_const);
    }
    else {
      HandleReadLock((char *)0xc36,iVar3);
      HndInfo = &local_70;
      UVar1 = GetHandleInfo(Hnd,HndInfo);
      if (UVar1 == HND_CLIENT) {
        HandleUnlock((char *)0xc3e,(int)HndInfo);
        iVar3 = -0x65;
        if ((ActionURL_const != (char *)0x0) &&
           (Fun != (Upnp_FunPtr)0x0 &&
            (Act != (IXML_Document *)0x0 && ServiceType_const != (char *)0x0))) {
          buf = ixmlPrintNode(&Header->n);
          buf_00 = ixmlPrintNode(&Act->n);
          if (buf_00 == (char *)0x0) {
            ixmlFreeDOMString(buf);
            iVar3 = -0x73;
          }
          else {
            arg = (job_arg *)calloc(1,0x760);
            if (arg == (job_arg *)0x0) {
              ixmlFreeDOMString(buf_00);
              ixmlFreeDOMString(buf);
              iVar3 = -0x68;
            }
            else {
              (arg->advertise).handle = 4;
              (arg->advertise).eventId = Hnd;
              strncpy((arg->action).Url,ActionURL_const,0xff);
              strncpy((arg->action).ServiceType,ServiceType_const,0xff);
              iVar2 = ixmlParseBufferEx(buf,&(arg->action).Header);
              if (iVar2 == 0) {
                iVar2 = ixmlParseBufferEx(buf_00,&(arg->action).Act);
                if (iVar2 == 0) {
                  ixmlFreeDOMString(buf_00);
                  ixmlFreeDOMString(buf);
                  (arg->action).Cookie = (char *)Cookie_const;
                  (arg->action).Fun = Fun;
                  TPJobInit(&job,UpnpThreadDistribution,arg);
                  TPJobSetFreeFunction(&job,free_action_arg);
                  TPJobSetPriority(&job,MED_PRIORITY);
                  iVar3 = ThreadPoolAdd(&gSendThreadPool,&job,(int *)0x0);
                  if (iVar3 != 0) {
                    free_action_arg(arg);
                  }
                  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xc88,
                             "Exiting UpnpSendActionAsync\n");
                  return 0;
                }
                ixmlDocument_free((arg->action).Header);
              }
              free(arg);
              ixmlFreeDOMString(buf_00);
              ixmlFreeDOMString(buf);
              iVar3 = -0x73;
              if (iVar2 == 0x66) {
                iVar3 = -0x68;
              }
            }
          }
        }
      }
      else {
        HandleUnlock((char *)0xc3b,(int)HndInfo);
        iVar3 = -100;
      }
    }
  }
  else {
    iVar3 = -0x74;
  }
  return iVar3;
}

Assistant:

int UpnpSendActionExAsync(UpnpClient_Handle Hnd,
	const char *ActionURL_const,
	const char *ServiceType_const,
	const char *DevUDN_const,
	IXML_Document *Header,
	IXML_Document *Act,
	Upnp_FunPtr Fun,
	const void *Cookie_const)
{
	struct Handle_Info *SInfo = NULL;
	struct UpnpNonblockParam *Param;
	DOMString tmpStr;
	DOMString headerStr = NULL;
	char *ActionURL = (char *)ActionURL_const;
	char *ServiceType = (char *)ServiceType_const;
	ThreadPoolJob job;
	int retVal = 0;

	memset(&job, 0, sizeof(job));

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpSendActionExAsync\n");

	if (Header == NULL) {
		retVal = UpnpSendActionAsync(Hnd,
			ActionURL_const,
			ServiceType_const,
			DevUDN_const,
			Act,
			Fun,
			Cookie_const);
		return retVal;
	}

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_CLIENT:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	HandleUnlock(__FILE__, __LINE__);

	if (ActionURL == NULL) {
		return UPNP_E_INVALID_PARAM;
	}
	if (ServiceType == NULL || Act == NULL || Fun == NULL) {
		return UPNP_E_INVALID_PARAM;
	}

	headerStr = ixmlPrintNode((IXML_Node *)Header);

	tmpStr = ixmlPrintNode((IXML_Node *)Act);
	if (tmpStr == NULL) {
		ixmlFreeDOMString(headerStr);
		return UPNP_E_INVALID_ACTION;
	}

	Param = (struct UpnpNonblockParam *)malloc(
		sizeof(struct UpnpNonblockParam));
	if (Param == NULL) {
		ixmlFreeDOMString(tmpStr);
		ixmlFreeDOMString(headerStr);
		return UPNP_E_OUTOF_MEMORY;
	}
	memset(Param, 0, sizeof(struct UpnpNonblockParam));

	Param->FunName = ACTION;
	Param->Handle = Hnd;
	strncpy(Param->Url, ActionURL, sizeof(Param->Url) - 1);
	strncpy(Param->ServiceType,
		ServiceType,
		sizeof(Param->ServiceType) - 1);
	retVal = ixmlParseBufferEx(headerStr, &(Param->Header));
	if (retVal != IXML_SUCCESS) {
		free(Param);
		ixmlFreeDOMString(tmpStr);
		ixmlFreeDOMString(headerStr);
		if (retVal == IXML_INSUFFICIENT_MEMORY) {
			return UPNP_E_OUTOF_MEMORY;
		} else {
			return UPNP_E_INVALID_ACTION;
		}
	}

	retVal = ixmlParseBufferEx(tmpStr, &(Param->Act));
	if (retVal != IXML_SUCCESS) {
		ixmlDocument_free(Param->Header);
		free(Param);
		ixmlFreeDOMString(tmpStr);
		ixmlFreeDOMString(headerStr);
		if (retVal == IXML_INSUFFICIENT_MEMORY) {
			return UPNP_E_OUTOF_MEMORY;
		} else {
			return UPNP_E_INVALID_ACTION;
		}
	}

	ixmlFreeDOMString(tmpStr);
	ixmlFreeDOMString(headerStr);

	Param->Cookie = (void *)Cookie_const;
	Param->Fun = Fun;

	TPJobInit(&job, (start_routine)UpnpThreadDistribution, Param);
	TPJobSetFreeFunction(&job, (free_routine)free_action_arg);

	TPJobSetPriority(&job, MED_PRIORITY);
	if (ThreadPoolAdd(&gSendThreadPool, &job, NULL) != 0) {
		free_action_arg((job_arg *)Param);
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpSendActionAsync\n");

	return UPNP_E_SUCCESS;
}